

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::is_per_primitive_variable(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  TypedID<(spirv_cross::Types)1> id_00;
  SPIRType *pSVar2;
  size_t sVar3;
  uint local_38;
  uint32_t n;
  uint32_t i;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  bVar1 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                     DecorationPerPrimitiveEXT);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
    pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    bVar1 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id,Block);
    if (bVar1) {
      local_38 = 0;
      sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(pSVar2->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      for (; local_38 < (uint)sVar3; local_38 = local_38 + 1) {
        id_00 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar2->super_IVariant).self);
        bVar1 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)id_00.id,local_38,DecorationPerPrimitiveEXT
                          );
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::is_per_primitive_variable(const SPIRVariable &var) const
{
	if (has_decoration(var.self, DecorationPerPrimitiveEXT))
		return true;

	auto &type = get<SPIRType>(var.basetype);
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0, n = uint32_t(type.member_types.size()); i < n; i++)
		if (!has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			return false;

	return true;
}